

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

void __thiscall QAuthenticatorPrivate::~QAuthenticatorPrivate(QAuthenticatorPrivate *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->userDomain).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->workstation).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->cnonce).d);
  QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::~QScopedPointer
            (&this->gssApiHandles);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->challenge).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->realm).d);
  QHash<QString,_QVariant>::~QHash(&this->options);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->password).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->extractedUser).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

QAuthenticatorPrivate::~QAuthenticatorPrivate() = default;